

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O1

CURLcode smtp_parse_address(char *fqma,char **address,hostname *host)

{
  CURLcode CVar1;
  char *__s;
  size_t sVar2;
  char *pcVar3;
  
  __s = (*Curl_cstrdup)(fqma + (*fqma == '<'));
  if (__s == (char *)0x0) {
    CVar1 = CURLE_OUT_OF_MEMORY;
  }
  else {
    sVar2 = strlen(__s);
    if ((sVar2 != 0) && (__s[sVar2 - 1] == '>')) {
      __s[sVar2 - 1] = '\0';
    }
    pcVar3 = strchr(__s,0x40);
    host->name = pcVar3;
    if (pcVar3 != (char *)0x0) {
      *pcVar3 = '\0';
      host->name = host->name + 1;
      Curl_idnconvert_hostname(host);
    }
    *address = __s;
    CVar1 = CURLE_OK;
  }
  return CVar1;
}

Assistant:

static CURLcode smtp_parse_address(const char *fqma, char **address,
                                   struct hostname *host)
{
  CURLcode result = CURLE_OK;
  size_t length;

  /* Duplicate the fully qualified email address so we can manipulate it,
     ensuring it does not contain the delimiters if specified */
  char *dup = strdup(fqma[0] == '<' ? fqma + 1  : fqma);
  if(!dup)
    return CURLE_OUT_OF_MEMORY;

  length = strlen(dup);
  if(length) {
    if(dup[length - 1] == '>')
      dup[length - 1] = '\0';
  }

  /* Extract the hostname from the address (if we can) */
  host->name = strpbrk(dup, "@");
  if(host->name) {
    *host->name = '\0';
    host->name = host->name + 1;

    /* Attempt to convert the hostname to IDN ACE */
    (void) Curl_idnconvert_hostname(host);

    /* If Curl_idnconvert_hostname() fails then we shall attempt to continue
       and send the hostname using UTF-8 rather than as 7-bit ACE (which is
       our preference) */
  }

  /* Extract the local address from the mailbox */
  *address = dup;

  return result;
}